

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileOptions::InternalSwap(FileOptions *this,FileOptions *other)

{
  InternalMetadata *this_00;
  ArenaStringPtr *pAVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  void *pvVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  ulong uVar20;
  string *psVar21;
  UnknownFieldSet *other_00;
  Arena *pAVar22;
  Arena *arena;
  ArenaStringPtr *pAVar23;
  
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar5 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar5 & 1) != 0) {
LAB_002a06e1:
      other_00 = (UnknownFieldSet *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 8);
      goto LAB_002a06e9;
    }
  }
  else {
    if (((ulong)pvVar5 & 1) != 0) goto LAB_002a06e1;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
LAB_002a06e9:
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>(this_00,other_00);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
  pAVar1 = &this->java_package_;
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar20 = (ulong)arena & 1;
  pAVar22 = arena;
  if (uVar20 != 0) {
    pAVar22 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar23 = &other->java_package_;
  psVar21 = pAVar1->ptr_;
  if (psVar21 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar23->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar21 = pAVar1->ptr_;
      goto LAB_002a0761;
    }
  }
  else {
LAB_002a0761:
    if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar23,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar21);
    arena = (Arena *)this_00->ptr_;
    uVar20 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->java_outer_classname_;
  pAVar22 = arena;
  if (uVar20 != 0) {
    pAVar22 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar23 = &other->java_outer_classname_;
  psVar21 = pAVar1->ptr_;
  if (psVar21 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar23->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar21 = pAVar1->ptr_;
      goto LAB_002a07e5;
    }
  }
  else {
LAB_002a07e5:
    if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar23,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar21);
    arena = (Arena *)this_00->ptr_;
    uVar20 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->go_package_;
  pAVar22 = arena;
  if (uVar20 != 0) {
    pAVar22 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar23 = &other->go_package_;
  psVar21 = pAVar1->ptr_;
  if (psVar21 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar23->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar21 = pAVar1->ptr_;
      goto LAB_002a0869;
    }
  }
  else {
LAB_002a0869:
    if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar23,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar21);
    arena = (Arena *)this_00->ptr_;
    uVar20 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->objc_class_prefix_;
  pAVar22 = arena;
  if (uVar20 != 0) {
    pAVar22 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar23 = &other->objc_class_prefix_;
  psVar21 = pAVar1->ptr_;
  if (psVar21 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar23->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar21 = pAVar1->ptr_;
      goto LAB_002a08ed;
    }
  }
  else {
LAB_002a08ed:
    if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar23,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar21);
    arena = (Arena *)this_00->ptr_;
    uVar20 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->csharp_namespace_;
  pAVar22 = arena;
  if (uVar20 != 0) {
    pAVar22 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar23 = &other->csharp_namespace_;
  psVar21 = pAVar1->ptr_;
  if (psVar21 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar23->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar21 = pAVar1->ptr_;
      goto LAB_002a0971;
    }
  }
  else {
LAB_002a0971:
    if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar23,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar21);
    arena = (Arena *)this_00->ptr_;
    uVar20 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->swift_prefix_;
  pAVar22 = arena;
  if (uVar20 != 0) {
    pAVar22 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar23 = &other->swift_prefix_;
  psVar21 = pAVar1->ptr_;
  if (psVar21 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar23->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar21 = pAVar1->ptr_;
      goto LAB_002a09f5;
    }
  }
  else {
LAB_002a09f5:
    if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar23,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar21);
    arena = (Arena *)this_00->ptr_;
    uVar20 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->php_class_prefix_;
  pAVar22 = arena;
  if (uVar20 != 0) {
    pAVar22 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar23 = &other->php_class_prefix_;
  psVar21 = pAVar1->ptr_;
  if (psVar21 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar23->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar21 = pAVar1->ptr_;
      goto LAB_002a0a79;
    }
  }
  else {
LAB_002a0a79:
    if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar23,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar21);
    arena = (Arena *)this_00->ptr_;
    uVar20 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->php_namespace_;
  pAVar22 = arena;
  if (uVar20 != 0) {
    pAVar22 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar23 = &other->php_namespace_;
  psVar21 = pAVar1->ptr_;
  if (psVar21 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar23->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar21 = pAVar1->ptr_;
      goto LAB_002a0aff;
    }
  }
  else {
LAB_002a0aff:
    if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar23,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar21);
    arena = (Arena *)this_00->ptr_;
    uVar20 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->php_metadata_namespace_;
  pAVar22 = arena;
  if (uVar20 != 0) {
    pAVar22 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar23 = &other->php_metadata_namespace_;
  psVar21 = pAVar1->ptr_;
  if (psVar21 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar23->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar21 = pAVar1->ptr_;
      goto LAB_002a0b85;
    }
  }
  else {
LAB_002a0b85:
    if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar23,pAVar22,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar21);
    arena = (Arena *)this_00->ptr_;
    uVar20 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->ruby_package_;
  if (uVar20 != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar23 = &other->ruby_package_;
  psVar21 = pAVar1->ptr_;
  if (psVar21 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_002a0c2c;
    internal::ArenaStringPtr::CreateInstance
              (pAVar1,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar21 = pAVar1->ptr_;
  }
  if (pAVar23->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar23,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar21);
LAB_002a0c2c:
  bVar12 = this->java_multiple_files_;
  bVar13 = this->java_generate_equals_and_hash_;
  bVar14 = this->java_string_check_utf8_;
  bVar15 = this->cc_generic_services_;
  bVar16 = this->java_generic_services_;
  bVar17 = this->py_generic_services_;
  bVar18 = this->php_generic_services_;
  bVar19 = this->deprecated_;
  bVar2 = other->java_generate_equals_and_hash_;
  bVar6 = other->java_string_check_utf8_;
  bVar7 = other->cc_generic_services_;
  bVar8 = other->java_generic_services_;
  bVar9 = other->py_generic_services_;
  bVar10 = other->php_generic_services_;
  bVar11 = other->deprecated_;
  this->java_multiple_files_ = other->java_multiple_files_;
  this->java_generate_equals_and_hash_ = bVar2;
  this->java_string_check_utf8_ = bVar6;
  this->cc_generic_services_ = bVar7;
  this->java_generic_services_ = bVar8;
  this->py_generic_services_ = bVar9;
  this->php_generic_services_ = bVar10;
  this->deprecated_ = bVar11;
  other->java_multiple_files_ = bVar12;
  other->java_generate_equals_and_hash_ = bVar13;
  other->java_string_check_utf8_ = bVar14;
  other->cc_generic_services_ = bVar15;
  other->java_generic_services_ = bVar16;
  other->py_generic_services_ = bVar17;
  other->php_generic_services_ = bVar18;
  other->deprecated_ = bVar19;
  iVar4 = this->optimize_for_;
  this->optimize_for_ = other->optimize_for_;
  other->optimize_for_ = iVar4;
  bVar2 = this->cc_enable_arenas_;
  this->cc_enable_arenas_ = other->cc_enable_arenas_;
  other->cc_enable_arenas_ = bVar2;
  return;
}

Assistant:

void FileOptions::InternalSwap(FileOptions* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
  java_package_.Swap(&other->java_package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  java_outer_classname_.Swap(&other->java_outer_classname_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  go_package_.Swap(&other->go_package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  objc_class_prefix_.Swap(&other->objc_class_prefix_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  csharp_namespace_.Swap(&other->csharp_namespace_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swift_prefix_.Swap(&other->swift_prefix_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  php_class_prefix_.Swap(&other->php_class_prefix_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  php_namespace_.Swap(&other->php_namespace_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  php_metadata_namespace_.Swap(&other->php_metadata_namespace_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ruby_package_.Swap(&other->ruby_package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(FileOptions, deprecated_)
      + sizeof(FileOptions::deprecated_)
      - PROTOBUF_FIELD_OFFSET(FileOptions, java_multiple_files_)>(
          reinterpret_cast<char*>(&java_multiple_files_),
          reinterpret_cast<char*>(&other->java_multiple_files_));
  swap(optimize_for_, other->optimize_for_);
  swap(cc_enable_arenas_, other->cc_enable_arenas_);
}